

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::LowerBailOnResultCondition
          (Lowerer *this,Instr *instr,LabelInstr **bailOutLabel,LabelInstr **skipBailOutLabel)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  LabelInstr *pLVar5;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x36cd,"(instr)","instr");
    if (!bVar2) goto LAB_005acf07;
    *puVar4 = 0;
  }
  BVar3 = IR::Instr::GetBailOutKind(instr);
  if ((BVar3 & BailOutOnResultConditions) == BailOutInvalid) {
    BVar3 = IR::Instr::GetBailOutKind(instr);
    if (BVar3 != BailOutOnFailedHoistedLoopCountBasedBoundCheck) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x36d0,
                         "(instr->GetBailOutKind() & IR::BailOutOnResultConditions || instr->GetBailOutKind() == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck)"
                         ,
                         "instr->GetBailOutKind() & IR::BailOutOnResultConditions || instr->GetBailOutKind() == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck"
                        );
      if (!bVar2) goto LAB_005acf07;
      *puVar4 = 0;
    }
  }
  if (bailOutLabel == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x36d1,"(bailOutLabel)","bailOutLabel");
    if (!bVar2) goto LAB_005acf07;
    *puVar4 = 0;
  }
  if (skipBailOutLabel == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x36d2,"(skipBailOutLabel)","skipBailOutLabel");
    if (!bVar2) {
LAB_005acf07:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pLVar5 = IR::LabelInstr::New(Label,instr->m_func,true);
  *bailOutLabel = pLVar5;
  IR::Instr::InsertBefore(instr,&pLVar5->super_Instr);
  pLVar5 = IR::LabelInstr::New(Label,instr->m_func,false);
  *skipBailOutLabel = pLVar5;
  IR::Instr::InsertAfter(instr,&pLVar5->super_Instr);
  GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  return;
}

Assistant:

void
Lowerer::LowerBailOnResultCondition(
    IR::Instr *const instr,
    IR::LabelInstr * *const bailOutLabel,
    IR::LabelInstr * *const skipBailOutLabel)
{
    Assert(instr);
    Assert(
        instr->GetBailOutKind() & IR::BailOutOnResultConditions ||
        instr->GetBailOutKind() == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);
    Assert(bailOutLabel);
    Assert(skipBailOutLabel);

    // Label to jump to (or fall through to) when bailing out. The actual bailout label
    // (bailOutInfo->bailOutInstr->AsLabelInstr()) may be shared, and code may be added to restore values before the jump to the
    // actual bailout label in the cloned bailout case, so always create a new bailout label for this particular path.
    *bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, true /* isOpHelper */);
    instr->InsertBefore(*bailOutLabel);

    // Label to jump to when not bailing out
    *skipBailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
    instr->InsertAfter(*skipBailOutLabel);

    // Generate the bailout helper call. 'instr' will be changed to the CALL into the bailout function, so it can't be used for
    // ordering instructions anymore.
    GenerateBailOut(instr);
}